

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

void __thiscall common_sampler::set_logits(common_sampler *this,llama_context *ctx,int idx)

{
  float fVar1;
  pointer plVar2;
  pointer plVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  float *pfVar8;
  ulong uVar9;
  
  lVar5 = llama_get_logits_ith(ctx,idx);
  uVar6 = llama_get_model(ctx);
  uVar6 = llama_model_get_vocab(uVar6);
  uVar4 = llama_vocab_n_tokens(uVar6);
  std::vector<llama_token_data,_std::allocator<llama_token_data>_>::resize
            (&this->cur,(long)(int)uVar4);
  plVar2 = (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = 0;
  uVar9 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar9 = uVar7;
  }
  pfVar8 = &plVar2->p;
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    fVar1 = *(float *)(lVar5 + uVar7 * 4);
    ((llama_token_data *)(pfVar8 + -2))->id = (llama_token)uVar7;
    pfVar8[-1] = fVar1;
    *pfVar8 = 0.0;
    pfVar8 = pfVar8 + 3;
  }
  plVar3 = (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->cur_p).data = plVar2;
  (this->cur_p).size = ((long)plVar3 - (long)plVar2) / 0xc;
  (this->cur_p).selected = -1;
  (this->cur_p).sorted = false;
  return;
}

Assistant:

void set_logits(struct llama_context * ctx, int idx) {
        const auto * logits = llama_get_logits_ith(ctx, idx);

        const llama_model * model = llama_get_model(ctx);
        const llama_vocab * vocab = llama_model_get_vocab(model);

        const int n_vocab = llama_vocab_n_tokens(vocab);

        cur.resize(n_vocab);

        for (llama_token token_id = 0; token_id < n_vocab; token_id++) {
            cur[token_id] = llama_token_data{token_id, logits[token_id], 0.0f};
        }

        cur_p = { cur.data(), cur.size(), -1, false };
    }